

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalGetFileTime
                    (CPalThread *pThread,HANDLE hFile,LPFILETIME lpCreationTime,
                    LPFILETIME lpLastAccessTime,LPFILETIME lpLastWriteTime)

{
  DWORD DVar1;
  int iVar2;
  LONG LVar3;
  FILETIME FVar4;
  undefined1 local_e8 [8];
  stat StatData;
  undefined8 *puStack_50;
  int Fd;
  IDataLock *pLocalDataLock;
  CFileProcessLocalData *pLocalData;
  IPalObject *pFileObject;
  LPFILETIME p_Stack_30;
  PAL_ERROR palError;
  LPFILETIME lpLastWriteTime_local;
  LPFILETIME lpLastAccessTime_local;
  LPFILETIME lpCreationTime_local;
  HANDLE hFile_local;
  CPalThread *pThread_local;
  
  pFileObject._4_4_ = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  puStack_50 = (undefined8 *)0x0;
  StatData.__glibc_reserved[2]._4_4_ = -1;
  p_Stack_30 = lpLastWriteTime;
  lpLastWriteTime_local = lpLastAccessTime;
  lpLastAccessTime_local = lpCreationTime;
  lpCreationTime_local = (LPFILETIME)hFile;
  hFile_local = pThread;
  if ((undefined1 *)hFile == &DAT_ffffffffffffffff) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    pFileObject._4_4_ = 6;
  }
  else {
    pFileObject._4_4_ =
         (**(code **)(*g_pObjectManager + 0x28))
                   (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pLocalData);
    if ((pFileObject._4_4_ == 0) &&
       (pFileObject._4_4_ =
             (*(code *)pLocalData->pLockController[3]._vptr_IFileLockController)
                       (pLocalData,hFile_local,0,&stack0xffffffffffffffb0,&pLocalDataLock),
       pFileObject._4_4_ == 0)) {
      StatData.__glibc_reserved[2]._4_4_ = *(int *)&pLocalDataLock[1]._vptr_IDataLock;
      if (StatData.__glibc_reserved[2]._4_4_ == -1) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        pFileObject._4_4_ = 6;
      }
      else {
        iVar2 = fstat64(StatData.__glibc_reserved[2]._4_4_,(stat64 *)local_e8);
        if (iVar2 == 0) {
          if (lpLastAccessTime_local != (LPFILETIME)0x0) {
            FVar4 = FILEUnixTimeToFileTime(StatData.st_mtim.tv_nsec,0);
            lpLastAccessTime_local->dwLowDateTime = FVar4.dwLowDateTime;
            lpLastAccessTime_local->dwHighDateTime = FVar4.dwHighDateTime;
          }
          if (p_Stack_30 != (FILETIME *)0x0) {
            FVar4 = FILEUnixTimeToFileTime(StatData.st_atim.tv_nsec,0);
            *p_Stack_30 = FVar4;
          }
          if (lpLastWriteTime_local != (LPFILETIME)0x0) {
            FVar4 = FILEUnixTimeToFileTime(StatData.st_blocks,0);
            lpLastWriteTime_local->dwLowDateTime = FVar4.dwLowDateTime;
            lpLastWriteTime_local->dwHighDateTime = FVar4.dwHighDateTime;
            if ((p_Stack_30 != (FILETIME *)0x0) &&
               (LVar3 = CompareFileTime(lpLastWriteTime_local,p_Stack_30), LVar3 < 0)) {
              DVar1 = p_Stack_30->dwHighDateTime;
              lpLastWriteTime_local->dwLowDateTime = p_Stack_30->dwLowDateTime;
              lpLastWriteTime_local->dwHighDateTime = DVar1;
            }
          }
        }
        else {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          pFileObject._4_4_ = FILEGetLastErrorFromErrno();
        }
      }
    }
  }
  if (puStack_50 != (undefined8 *)0x0) {
    (**(code **)*puStack_50)(puStack_50,hFile_local,0);
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController[8]._vptr_IFileLockController)(pLocalData,hFile_local);
  }
  return pFileObject._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalGetFileTime(
        CPalThread *pThread,
        IN HANDLE hFile,
        OUT LPFILETIME lpCreationTime,
        OUT LPFILETIME lpLastAccessTime,
        OUT LPFILETIME lpLastWriteTime)
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    int   Fd = -1;

    struct stat StatData;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalGetFileTimeExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalGetFileTimeExit;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalGetFileTimeExit;
    }

    Fd = pLocalData->unix_fd;

    if ( Fd == -1 )
    {
        TRACE("pLocalData = [%p], Fd = %d\n", pLocalData, Fd);
        palError = ERROR_INVALID_HANDLE;
        goto InternalGetFileTimeExit;
    }

    if ( fstat(Fd, &StatData) != 0 )
    {
        TRACE("fstat failed on file descriptor %d\n", Fd);
        palError = FILEGetLastErrorFromErrno();
        goto InternalGetFileTimeExit;
    }

    if ( lpCreationTime )
    {
        *lpCreationTime = FILEUnixTimeToFileTime(StatData.st_ctime,
                                                 ST_CTIME_NSEC(&StatData));
    }
    if ( lpLastWriteTime )
    {
        *lpLastWriteTime = FILEUnixTimeToFileTime(StatData.st_mtime,
                                                  ST_MTIME_NSEC(&StatData));
    }
    if ( lpLastAccessTime )
    {
        *lpLastAccessTime = FILEUnixTimeToFileTime(StatData.st_atime,
                                                   ST_ATIME_NSEC(&StatData));
        /* if Unix mtime is greater than atime, return mtime as the last
           access time */
        if ( lpLastWriteTime &&
             CompareFileTime(lpLastAccessTime, lpLastWriteTime) < 0 )
        {
            *lpLastAccessTime = *lpLastWriteTime;
        }
    }

InternalGetFileTimeExit:
    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}